

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall
fmp4_stream::emsg::write_emsg_as_mpd_event(emsg *this,ostream *ostr,uint64_t base_time)

{
  int iVar1;
  ostream *poVar2;
  uchar *puVar3;
  size_type sVar4;
  ulong local_88;
  string local_70;
  string local_40;
  uint64_t local_20;
  uint64_t base_time_local;
  ostream *ostr_local;
  emsg *this_local;
  
  local_20 = base_time;
  base_time_local = (uint64_t)ostr;
  ostr_local = (ostream *)this;
  poVar2 = std::operator<<(ostr,"<event ");
  poVar2 = std::operator<<(poVar2,"presentationtime=");
  poVar2 = std::operator<<(poVar2,'\"');
  if ((this->super_full_box).super_box.field_0x62 == '\0') {
    local_88 = local_20 + this->presentation_time_delta_;
  }
  else {
    local_88 = this->presentation_time_;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_88);
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"duration=");
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->event_duration_);
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"id=");
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->id_);
  std::operator<<(poVar2,'\"');
  iVar1 = std::__cxx11::string::compare((char *)&this->scheme_id_uri_);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)base_time_local,'>');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"  <signal xmlns=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,"http://www.scte.org/schemas/35/2016");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,'>');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"    <binary>");
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->message_data_);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    base64_encode_abi_cxx11_(&local_40,puVar3,sVar4 & 0xffffffff);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,"</binary>");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"  </signal>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    poVar2 = std::operator<<((ostream *)base_time_local," ");
    poVar2 = std::operator<<(poVar2,"contentencoding=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,"base64");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,'>');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->message_data_);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    base64_encode_abi_cxx11_(&local_70,puVar3,sVar4 & 0xffffffff);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
  }
  poVar2 = std::operator<<((ostream *)base_time_local,"</event>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void emsg::write_emsg_as_mpd_event(std::ostream &ostr, uint64_t base_time) const
	{
		ostr << "<event "
			<< "presentationtime=" << '"' << (this->version_ ? presentation_time_ : base_time + presentation_time_delta_) << '"' << " "  \
			<< "duration=" << '"' << event_duration_ << '"' << " "  \
			<< "id=" << '"' << id_ << '"';
		if (this->scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
		{
			ostr << '>' << std::endl << "  <signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
				<< "    <binary>" << base64_encode(this->message_data_.data(), (unsigned int)this->message_data_.size()) << "</binary>" << std::endl
				<< "  </signal>" << std::endl;
		}
		else {
			ostr << " " << "contentencoding=" << '"' << "base64" << '"' << '>' << std::endl
				<< base64_encode(this->message_data_.data(), (unsigned int)this->message_data_.size()) << std::endl;
		}
		ostr << "</event>" << std::endl;
	}